

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_spirv_c.cpp
# Opt level: O1

bool __thiscall
Remapper::remap_vertex_input(Remapper *this,D3DStageIO *d3d_input,VulkanStageIO *vk_input)

{
  dxil_spv_bool dVar1;
  dxil_spv_vulkan_vertex_input c_vk_input;
  dxil_spv_d3d_vertex_input c_input;
  dxil_spv_vulkan_vertex_input local_24;
  dxil_spv_d3d_vertex_input local_20;
  
  local_20.semantic = d3d_input->semantic;
  local_20.semantic_index = d3d_input->semantic_index;
  local_20.start_row = d3d_input->start_row;
  local_20.rows = d3d_input->rows;
  local_24.location = 0;
  if (this->input_remapper == (dxil_spv_vertex_input_remapper_cb)0x0) {
    vk_input->location = local_20.start_row;
  }
  else {
    dVar1 = (*this->input_remapper)(this->input_userdata,&local_20,&local_24);
    if (dVar1 != '\x01') {
      return false;
    }
    vk_input->location = local_24.location;
    vk_input->component = 0;
  }
  return true;
}

Assistant:

bool remap_vertex_input(const D3DStageIO &d3d_input, VulkanStageIO &vk_input) override
	{
		dxil_spv_d3d_vertex_input c_input = { d3d_input.semantic, d3d_input.semantic_index, d3d_input.start_row,
			                                  d3d_input.rows };
		dxil_spv_vulkan_vertex_input c_vk_input = {};

		if (input_remapper)
		{
			if (input_remapper(input_userdata, &c_input, &c_vk_input) == DXIL_SPV_TRUE)
			{
				vk_input.location = c_vk_input.location;
				vk_input.component = 0;
				return true;
			}
			else
				return false;
		}
		else
		{
			vk_input.location = d3d_input.start_row;
			return true;
		}
	}